

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall
addrman_tests::caddrinfo_get_tried_bucket::test_method(caddrinfo_get_tried_bucket *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CService ipIn_02;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  AddrInfo *pAVar6;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  span<const_std::byte,_18446744073709551615UL> source;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff9cc;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffff9d0;
  int *piVar10;
  undefined8 in_stack_fffffffffffff9d8;
  char *pcVar11;
  undefined8 in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  int local_5b4;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  _Bvector_base<std::allocator<bool>_> local_4f0;
  NetGroupManager ngm_asmap;
  vector<bool,_std::allocator<bool>_> asmap;
  CService local_470;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  CNetAddr local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  CService local_368;
  int bucket;
  undefined4 uStack_33c;
  undefined8 local_338;
  shared_count asStack_330 [5];
  AddrInfo infoj;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  CService local_f8;
  CAddress addr2;
  CService local_98;
  CAddress addr1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  source._M_extent._M_extent_value = 0x3b;
  source._M_ptr = test::data::detail_asmap_raw;
  FromBytes(&asmap,source);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_4f0,&asmap);
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_4f0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       local_4f0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  local_4f0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_4f0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ngm_asmap.m_asmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_4f0._M_impl.super__Bvector_impl_data._M_end_of_storage;
  local_4f0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_4f0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_4f0._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_4f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.1.1",(allocator<char> *)&info2);
  ResolveService(&local_98,(string *)&info1,0x208d);
  ipIn.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffff9cc;
  ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffff9c8;
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff9d0;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff9d8;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffff9e0;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffff9e8;
  CAddress::CAddress(&addr1,ipIn,(ServiceFlags)&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
  std::__cxx11::string::~string((string *)&info1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.1.1",(allocator<char> *)&info2);
  ResolveService(&local_f8,(string *)&info1,9999);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffff9cc;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffff9c8;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff9d0;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff9d8;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffff9e0;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffff9e8;
  CAddress::CAddress(&addr2,ipIn_00,(ServiceFlags)&local_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  std::__cxx11::string::~string((string *)&info1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&info1,"250.1.1.1",(allocator<char> *)&info2);
  ResolveIP(&source1,(string *)&info1);
  std::__cxx11::string::~string((string *)&info1);
  AddrInfo::AddrInfo(&info1,&addr1,&source1);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  ser_writedata32<HashWriter>((HashWriter *)&info2,1);
  HashWriter::GetHash(&nKey1,(HashWriter *)&info2);
  info2.source.m_addr._union._8_8_ = 0;
  info2.source.m_addr._size = 0;
  info2.source.m_addr._20_4_ = 0;
  info2.m_last_count_attempt.__d.__r = (duration)0;
  info2.source.m_addr._union.indirect_contents.indirect = (char *)0x0;
  info2.super_CAddress.nServices = NODE_NONE;
  info2.m_last_try.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.port = 0;
  info2.super_CAddress.super_CService._34_6_ = 0;
  info2.super_CAddress.nTime.__d.__r = (duration)0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_net = NET_UNROUTABLE;
  info2.super_CAddress.super_CService.super_CNetAddr.m_scope_id = 0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  info2.source.m_net = NET_UNROUTABLE;
  info2.source.m_scope_id = 0;
  CSHA256::CSHA256((CSHA256 *)&info2);
  ser_writedata32<HashWriter>((HashWriter *)&info2,2);
  HashWriter::GetHash(&nKey2,(HashWriter *)&info2);
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x256;
  file.m_begin = (iterator)&local_500;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_510,msg);
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._0_4_ =
       AddrInfo::GetTriedBucket(&info1,&nKey1,&ngm_asmap);
  pAVar6 = &infoj;
  bucket = 0xec;
  pcVar11 = "236";
  pvVar5 = (iterator)0x2;
  piVar10 = &bucket;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&info2,&local_520,0x256,1,2,pAVar6,0xb4fc89);
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pAVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x25a;
  file_00.m_begin = (iterator)&local_530;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_540,
             msg_00);
  iVar3 = AddrInfo::GetTriedBucket(&info1,&nKey1,&ngm_asmap);
  iVar4 = AddrInfo::GetTriedBucket(&info1,&nKey2,&ngm_asmap);
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union.direct[0] = iVar3 != iVar4;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._size = 0;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
  _bucket = "info1.GetTriedBucket(nKey1, ngm_asmap) != info1.GetTriedBucket(nKey2, ngm_asmap)";
  local_338 = (long)
              "info1.GetTriedBucket(nKey1, ngm_asmap) != info1.GetTriedBucket(nKey2, ngm_asmap)" +
              0x50;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  info2.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  info2.super_CAddress.super_CService.super_CNetAddr._24_8_ = &bucket;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&infoj,(lazy_ostream *)&info2,1,0,WARN,(check_type)piVar10,
             (size_t)&local_550,0x25a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._size);
  AddrInfo::AddrInfo(&info2,&addr2,&source1);
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x260;
  file_01.m_begin = (iterator)&local_560;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_570,
             msg_01);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                   (CService *)&info1);
  CService::GetKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388,
                   (CService *)&info2);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  infoj.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_3a8;
  local_3a8._M_dataplus._M_p = "info1.GetKey() != info2.GetKey()";
  local_3a8._M_string_length = 0xb4fabe;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_578 = "";
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  bucket._0_1_ = (readonly_property<bool>)(readonly_property<bool>)!bVar2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoj,1,0,WARN,(check_type)piVar10,
             (size_t)&local_580,0x260);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&buckets);
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x261;
  file_02.m_begin = (iterator)&local_590;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5a0,
             msg_02);
  iVar3 = AddrInfo::GetTriedBucket(&info1,&nKey1,&ngm_asmap);
  iVar4 = AddrInfo::GetTriedBucket(&info2,&nKey1,&ngm_asmap);
  bucket._0_1_ = (readonly_property<bool>)(readonly_property<bool>)(iVar3 != iVar4);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  buckets._M_t._M_impl._0_8_ = anon_var_dwarf_127bf6;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (long)"info1.GetTriedBucket(nKey1, ngm_asmap) != info2.GetTriedBucket(nKey1, ngm_asmap)" +
       0x50;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5a8 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  infoj.super_CAddress.super_CService.super_CNetAddr._24_8_ = &buckets;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoj,1,0,WARN,(check_type)piVar10,
             (size_t)&local_5b0,0x261);
  boost::detail::shared_count::~shared_count(asStack_330);
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &buckets._M_t._M_impl.super__Rb_tree_header._M_header;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       buckets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (local_5b4 = 0; local_5b4 < 0xff; local_5b4 = local_5b4 + 1) {
    util::ToString<int>(&local_3c8,&local_5b4);
    std::operator+(&local_3a8,"101.",&local_3c8);
    std::operator+(&local_388,&local_3a8,".1.1");
    ResolveService(&local_368,&local_388,0);
    ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar9;
    ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar8;
    ipIn_01.super_CNetAddr.m_addr._union._8_8_ = piVar10;
    ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar11;
    ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffff9e0;
    ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
    ipIn_01._32_8_ = in_stack_fffffffffffff9e8;
    CAddress::CAddress((CAddress *)&bucket,ipIn_01,(ServiceFlags)&local_368);
    util::ToString<int>(&local_448,&local_5b4);
    std::operator+(&local_428,"101.",&local_448);
    std::operator+(&local_408,&local_428,".1.1");
    ResolveIP(&local_3e8,&local_408);
    AddrInfo::AddrInfo(&infoj,(CAddress *)&bucket,&local_3e8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_3e8.m_addr);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    iVar3 = AddrInfo::GetTriedBucket(&infoj,&nKey1,&ngm_asmap);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    AddrInfo::~AddrInfo(&infoj);
  }
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x26d;
  file_03.m_begin = (iterator)&local_5c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_5d8,
             msg_03);
  infoj.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_388;
  bucket._0_1_ = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (8 < buckets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p = "buckets.size() > 8";
  local_388._M_string_length = 0xb4fd6d;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5e0 = "";
  uVar8 = 0;
  uVar9 = 0;
  pvVar5 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoj,1,0,WARN,(check_type)piVar10,
             (size_t)&local_5e8,0x26d);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&buckets._M_t);
  for (local_5b4 = 0; local_5b4 < 0xff; local_5b4 = local_5b4 + 1) {
    util::ToString<int>(&local_3c8,&local_5b4);
    std::operator+(&local_3a8,"250.",&local_3c8);
    std::operator+(&local_388,&local_3a8,".1.1");
    ResolveService(&local_470,&local_388,0);
    ipIn_02.super_CNetAddr.m_addr._union._4_4_ = uVar9;
    ipIn_02.super_CNetAddr.m_addr._union._0_4_ = uVar8;
    ipIn_02.super_CNetAddr.m_addr._union._8_8_ = piVar10;
    ipIn_02.super_CNetAddr.m_addr._16_8_ = pcVar11;
    ipIn_02.super_CNetAddr.m_net = (int)in_stack_fffffffffffff9e0;
    ipIn_02.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
    ipIn_02._32_8_ = in_stack_fffffffffffff9e8;
    CAddress::CAddress((CAddress *)&bucket,ipIn_02,(ServiceFlags)&local_470);
    util::ToString<int>(&local_448,&local_5b4);
    std::operator+(&local_428,"250.",&local_448);
    std::operator+(&local_408,&local_428,".1.1");
    ResolveIP(&local_3e8,&local_408);
    AddrInfo::AddrInfo(&infoj,(CAddress *)&bucket,&local_3e8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_3e8.m_addr);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&bucket);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_470);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    iVar3 = AddrInfo::GetTriedBucket(&infoj,&nKey1,&ngm_asmap);
    bucket = iVar3;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&buckets,
               &bucket);
    AddrInfo::~AddrInfo(&infoj);
  }
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x279;
  file_04.m_begin = (iterator)&local_5f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_608,
             msg_04);
  bucket._0_1_ = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (buckets._M_t._M_impl.super__Rb_tree_header._M_node_count == 8);
  local_338 = (element_type *)0x0;
  asStack_330[0].pi_ = (sp_counted_base *)0x0;
  local_388._M_dataplus._M_p = "buckets.size() == 8";
  local_388._M_string_length = 0xb4fd81;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ =
       infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       "<W\x1b";
  infoj.super_CAddress.super_CService.super_CNetAddr.m_addr._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  infoj.super_CAddress.super_CService.super_CNetAddr._24_8_ = &local_388;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&bucket,(lazy_ostream *)&infoj,1,0,WARN,(check_type)piVar10,
             (size_t)&stack0xfffffffffffff9e8,0x279);
  boost::detail::shared_count::~shared_count(asStack_330);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&buckets._M_t);
  AddrInfo::~AddrInfo(&info2);
  AddrInfo::~AddrInfo(&info1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source1.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&ngm_asmap);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&asmap.super__Bvector_base<std::allocator<bool>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_tried_bucket)
{
    std::vector<bool> asmap = FromBytes(test::data::asmap);
    NetGroupManager ngm_asmap{asmap};

    CAddress addr1 = CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.1.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.1.1");


    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    BOOST_CHECK_EQUAL(info1.GetTriedBucket(nKey1, ngm_asmap), 236);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetTriedBucket(nKey1, ngm_asmap) != info1.GetTriedBucket(nKey2, ngm_asmap));

    // Test: Two addresses with same IP but different ports can map to
    //  different buckets because they have different keys.
    AddrInfo info2 = AddrInfo(addr2, source1);

    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK(info1.GetTriedBucket(nKey1, ngm_asmap) != info2.GetTriedBucket(nKey1, ngm_asmap));

    std::set<int> buckets;
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("101." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("101." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix MAY map to more than
    // 8 buckets.
    BOOST_CHECK(buckets.size() > 8);

    buckets.clear();
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("250." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, ngm_asmap);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix MAY NOT map to more than
    // 8 buckets.
    BOOST_CHECK(buckets.size() == 8);
}